

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeKHR
          (Builder *this,Id component,Id scope,Id rows,Id cols,Id use)

{
  key_type kVar1;
  bool bVar2;
  Id IVar3;
  Scope value;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *this_00;
  char *pcVar7;
  mapped_type_conflict *pmVar8;
  Id local_24c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  Id local_230;
  allocator<char> local_229;
  Id debugResultId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_79;
  string local_78 [8];
  string debugName;
  anon_class_8_1_8991fb9c findName;
  key_type local_48 [4];
  Instruction *pIStack_38;
  int t;
  Instruction *type;
  Id local_28;
  Id use_local;
  Id cols_local;
  Id rows_local;
  Id scope_local;
  Id component_local;
  Builder *this_local;
  
  local_48[3] = 0;
  type._4_4_ = use;
  local_28 = cols;
  use_local = rows;
  cols_local = scope;
  rows_local = component;
  _scope_local = this;
  while( true ) {
    kVar1 = local_48[3];
    local_48[2] = 0x1168;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_48 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar3 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar3,0,OpTypeCooperativeMatrixKHR);
      pIStack_38 = this_00;
      spv::Instruction::reserveOperands(this_00,5);
      spv::Instruction::addIdOperand(pIStack_38,rows_local);
      spv::Instruction::addIdOperand(pIStack_38,cols_local);
      spv::Instruction::addIdOperand(pIStack_38,use_local);
      spv::Instruction::addIdOperand(pIStack_38,local_28);
      spv::Instruction::addIdOperand(pIStack_38,type._4_4_);
      local_48[0] = 0x1168;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_48);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffc8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&findName,
                 pIStack_38);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&findName);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&findName);
      Module::mapInstruction(&this->module,pIStack_38);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        debugName.field_2._8_8_ = this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_78,"coopmat<",&local_79);
        std::allocator<char>::~allocator(&local_79);
        pcVar7 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)((long)&debugName.field_2 + 8),rows_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar7,&local_c1);
        std::operator+(&local_a0,&local_c0,", ");
        std::__cxx11::string::operator+=(local_78,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        bVar2 = isConstantScalar(this,cols_local);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"gl_Scope",&local_129);
          value = getConstantScalar(this,cols_local);
          pcVar7 = ScopeToString(value);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pcVar7,&local_151)
          ;
          std::operator+(&local_108,&local_128,&local_150);
          std::operator+(&local_e8,&local_108,", ");
          std::__cxx11::string::operator+=(local_78,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator(&local_151);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator(&local_129);
        }
        else {
          pcVar7 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)((long)&debugName.field_2 + 8),cols_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar7,&local_199)
          ;
          std::operator+(&local_178,&local_198,", ");
          std::__cxx11::string::operator+=(local_78,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
        }
        pcVar7 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)((long)&debugName.field_2 + 8),use_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar7,&local_1e1);
        std::operator+(&local_1c0,&local_1e0,", ");
        std::__cxx11::string::operator+=(local_78,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        pcVar7 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)((long)&debugName.field_2 + 8),local_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&debugResultId,pcVar7,&local_229);
        std::operator+(&local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugResultId,">");
        std::__cxx11::string::operator+=(local_78,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&debugResultId);
        std::allocator<char>::~allocator(&local_229);
        memset(&local_248,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_248);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        IVar3 = makeCompositeDebugType
                          (this,&local_248,pcVar7,NonSemanticShaderDebugInfo100Structure,true);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_248);
        local_230 = IVar3;
        local_24c = spv::Instruction::getResultId(pIStack_38);
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_24c);
        *pmVar8 = IVar3;
        std::__cxx11::string::~string(local_78);
      }
      IVar3 = spv::Instruction::getResultId(pIStack_38);
      return IVar3;
    }
    local_48[1] = 0x1168;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_48 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_48[3]);
    pIStack_38 = *ppIVar6;
    IVar3 = spv::Instruction::getIdOperand(pIStack_38,0);
    if ((((IVar3 == rows_local) &&
         (IVar3 = spv::Instruction::getIdOperand(pIStack_38,1), IVar3 == cols_local)) &&
        (IVar3 = spv::Instruction::getIdOperand(pIStack_38,2), IVar3 == use_local)) &&
       ((IVar3 = spv::Instruction::getIdOperand(pIStack_38,3), IVar3 == local_28 &&
        (IVar3 = spv::Instruction::getIdOperand(pIStack_38,4), IVar3 == type._4_4_)))) break;
    local_48[3] = local_48[3] + 1;
  }
  IVar3 = spv::Instruction::getResultId(pIStack_38);
  return IVar3;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeKHR(Id component, Id scope, Id rows, Id cols, Id use)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeMatrixKHR].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeMatrixKHR][t];
        if (type->getIdOperand(0) == component &&
            type->getIdOperand(1) == scope &&
            type->getIdOperand(2) == rows &&
            type->getIdOperand(3) == cols &&
            type->getIdOperand(4) == use)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeMatrixKHR);
    type->reserveOperands(5);
    type->addIdOperand(component);
    type->addIdOperand(scope);
    type->addIdOperand(rows);
    type->addIdOperand(cols);
    type->addIdOperand(use);
    groupedTypes[OpTypeCooperativeMatrixKHR].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        // Find a name for one of the parameters. It can either come from debuginfo for another
        // type, or an OpName from a constant.
        auto const findName = [&](Id id) {
            Id id2 = debugId[id];
            for (auto &t : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic]) {
                if (t->getResultId() == id2) {
                    for (auto &s : strings) {
                        if (s->getResultId() == t->getIdOperand(2)) {
                            return s->getNameString();
                        }
                    }
                }
            }
            for (auto &t : names) {
                if (t->getIdOperand(0) == id) {
                    return t->getNameString();
                }
            }
            return "unknown";
        };
        std::string debugName = "coopmat<";
        debugName += std::string(findName(component)) + ", ";
        if (isConstantScalar(scope)) {
            debugName += std::string("gl_Scope") + std::string(spv::ScopeToString((spv::Scope)getConstantScalar(scope))) + ", ";
        } else {
            debugName += std::string(findName(scope)) + ", ";
        }
        debugName += std::string(findName(rows)) + ", ";
        debugName += std::string(findName(cols)) + ">";
        // There's no nonsemantic debug info instruction for cooperative matrix types,
        // use opaque composite instead.
        auto const debugResultId = makeCompositeDebugType({}, debugName.c_str(), NonSemanticShaderDebugInfo100Structure, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}